

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O2

void absl::lts_20250127::StrAppend<>
               (Nonnull<std::string_*> dest,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d,
               AlphaNum *e)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_t local_30;
  char *pcStack_28;
  size_t local_20;
  char *pcStack_18;
  size_t local_10;
  char *pcStack_8;
  
  local_50._M_dataplus._M_p = (pointer)(a->piece_)._M_len;
  local_50._M_string_length = (size_type)(a->piece_)._M_str;
  local_50.field_2._M_allocated_capacity = (b->piece_)._M_len;
  local_50.field_2._8_8_ = (b->piece_)._M_str;
  local_30 = (c->piece_)._M_len;
  pcStack_28 = (c->piece_)._M_str;
  local_20 = (d->piece_)._M_len;
  pcStack_18 = (d->piece_)._M_str;
  local_10 = (e->piece_)._M_len;
  pcStack_8 = (e->piece_)._M_str;
  pieces._M_len = (size_type)c;
  pieces._M_array = (iterator)0x5;
  strings_internal::AppendPieces((strings_internal *)dest,&local_50,pieces);
  return;
}

Assistant:

inline void StrAppend(absl::Nonnull<std::string*> dest, const AlphaNum& a,
                      const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
                      const AlphaNum& e, const AV&... args) {
  strings_internal::AppendPieces(
      dest, {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
             static_cast<const AlphaNum&>(args).Piece()...});
}